

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O0

QVariant * __thiscall QSpinBoxPrivate::calculateAdaptiveDecimalStep(QSpinBoxPrivate *this,int steps)

{
  int iVar1;
  long in_RSI;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  __type_conflict1 _Var2;
  int log;
  int signCompensation;
  bool stepsNegative;
  bool valueNegative;
  int absValue;
  int intValue;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = ::QVariant::toInt((bool *)(in_RSI + 0x2a0));
  iVar1 = qAbs<int>(&local_c);
  if (iVar1 < 100) {
    ::QVariant::QVariant(in_RDI,1);
  }
  else {
    std::log10<int>(0);
    _Var2 = std::pow<int,int>(0,0x694312);
    ::QVariant::QVariant(in_RDI,(int)_Var2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QSpinBoxPrivate::calculateAdaptiveDecimalStep(int steps) const
{
    const int intValue = value.toInt();
    const int absValue = qAbs(intValue);

    if (absValue < 100)
        return 1;

    const bool valueNegative = intValue < 0;
    const bool stepsNegative = steps < 0;
    const int signCompensation = (valueNegative == stepsNegative) ? 0 : 1;

    const int log = static_cast<int>(std::log10(absValue - signCompensation)) - 1;
    return static_cast<int>(std::pow(10, log));
}